

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReader.h
# Opt level: O0

void __thiscall
anurbs::DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>
          (DataReader *this,string *key,Matrix<double,_1,_3,_1,_1,_3> *vector)

{
  const_reference pvVar1;
  size_type sVar2;
  size_type sVar3;
  Index IVar4;
  Scalar *pSVar5;
  double dVar6;
  size_type local_48;
  Index i;
  undefined1 local_30 [8];
  value_type data;
  Matrix<double,_1,_3,_1,_1,_3> *vector_local;
  string *key_local;
  DataReader *this_local;
  
  data.m_value = (json_value)vector;
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(this->m_data,key);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_30,pvVar1);
  sVar2 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_30);
  sVar3 = Eigen::EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::size
                    ((EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)vector);
  if (sVar2 == sVar3) {
    local_48 = 0;
    while( true ) {
      IVar4 = length<nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_30);
      if (IVar4 <= (long)local_48) break;
      pvVar1 = nlohmann::
               basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_30,local_48);
      dVar6 = nlohmann::
              basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator_double<double,_0>(pvVar1);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)vector,
                          local_48);
      *pSVar5 = dVar6;
      local_48 = local_48 + 1;
    }
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_30);
    return;
  }
  __assert_fail("data.size() == vector.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/DataReader.h"
                ,0x33,
                "void anurbs::DataReader::fill_vector(const std::string &, T) const [T = Eigen::Matrix<double, 1, 3>]"
               );
}

Assistant:

void fill_vector(const std::string& key, T vector) const
    {
        const auto data = m_data.at(key);
        
        assert(data.size() == vector.size());

        for (Index i = 0; i < length(data); i++) {
            vector[i] = data.at(i);
        }
    }